

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void hashTableDestroy(HASH_TABLE *table)

{
  NAMED *p;
  size_t i;
  HASH_TABLE *table_local;
  
  for (p = (NAMED *)0x0; p < (NAMED *)table->size; p = (NAMED *)((long)&p->name + 1)) {
    if (table->v[(long)p] != (NAMED *)0x0) {
      (*table->mem->free_fcn)(table->v[(long)p]);
    }
  }
  if (table->v != (NAMED **)0x0) {
    (*table->mem->free_fcn)(table->v);
  }
  return;
}

Assistant:

static
void hashTableDestroy(HASH_TABLE *table)
{
  size_t i;
  for (i = 0; i < table->size; i++) {
    NAMED *p = table->v[i];
    if (p)
      table->mem->free_fcn(p);
  }
  if (table->v)
    table->mem->free_fcn(table->v);
}